

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
FindNextProperty_BigPropertyIndex
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          ScriptContext *scriptContext,int *index,JavascriptString **propertyStringName,
          PropertyId *propertyId,PropertyAttributes *attributes,Type *type,
          DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  EnumeratorFlags EVar1;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  JavascriptString *key;
  code *pcVar2;
  PropertyRecord *pPVar3;
  bool bVar4;
  int iVar5;
  PropertyId propertyId_00;
  undefined4 *puVar6;
  ScriptContext *pSVar7;
  SimpleDictionaryPropertyDescriptor<int> *pSVar8;
  JavascriptString **ppJVar9;
  PropertyString *pPVar10;
  DynamicTypeHandler *pDVar11;
  PropertyRecord *local_70;
  PropertyRecord *propertyRecord;
  DynamicTypeHandler *local_60;
  ScriptContext *local_58;
  EnumeratorFlags *local_50;
  SimpleDictionaryPropertyDescriptor<int> local_48;
  SimpleDictionaryPropertyDescriptor<int> descriptor;
  
  local_58 = scriptContext;
  local_50 = attributes;
  descriptor = (SimpleDictionaryPropertyDescriptor<int>)propertyStringName;
  if (propertyStringName == (JavascriptString **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f0,"(propertyStringName)","propertyStringName");
    if (!bVar4) goto LAB_00c5a265;
    *puVar6 = 0;
  }
  if (propertyId == (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f1,"(propertyId)","propertyId");
    if (!bVar4) goto LAB_00c5a265;
    *puVar6 = 0;
  }
  if (type == (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f2,"(type)","type");
    if (!bVar4) goto LAB_00c5a265;
    *puVar6 = 0;
  }
  if (typeToEnumerate == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2f3,"(typeToEnumerate)","typeToEnumerate");
    if (!bVar4) {
LAB_00c5a265:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((DynamicType *)type == typeToEnumerate) {
    iVar5 = *index;
    while (this_00 = (this->propertyMap).ptr, iVar5 < this_00->count - this_00->freeCount) {
      pSVar8 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,iVar5);
      EVar1 = pSVar8->Attributes;
      if (((EVar1 & (EphemeralReference|UseCache)) == None) &&
         (((flags & EnumNonEnumerable) != None || ((EVar1 & EnumNonEnumerable) != None)))) {
        ppJVar9 = JsUtil::
                  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        pSVar7 = local_58;
        key = *ppJVar9;
        if (local_50 != (EnumeratorFlags *)0x0) {
          *local_50 = EVar1;
        }
        propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(local_58,key);
        *propertyId = propertyId_00;
        pPVar10 = ScriptContext::GetPropertyString(pSVar7,propertyId_00);
        *(PropertyString **)descriptor = pPVar10;
        return 1;
      }
      iVar5 = *index + 1;
      *index = iVar5;
    }
  }
  else {
    pDVar11 = (typeToEnumerate->typeHandler).ptr;
    propertyRecord = (PropertyRecord *)__tls_get_addr(&PTR_013e5f18);
    local_60 = pDVar11;
    while (iVar5 = (*pDVar11->_vptr_DynamicTypeHandler[0xb])
                             (pDVar11,local_58,index,descriptor,propertyId,local_50,typeToEnumerate,
                              typeToEnumerate,(ulong)flags,instance,info), iVar5 != 0) {
      local_48._0_2_ = 0x701;
      local_48.propertyIndex = -1;
      if (*propertyId == -1) {
        if (*(long *)descriptor != 0) {
          bVar4 = JsUtil::
                  BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                  ::TryGetValue<Js::JavascriptString*>
                            ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                              *)(this->propertyMap).ptr,(JavascriptString **)descriptor,&local_48);
          goto LAB_00c5a1a4;
        }
      }
      else {
        pSVar7 = Js::Type::GetScriptContext(type);
        local_70 = ScriptContext::GetPropertyName(pSVar7,*propertyId);
        if (((flags & EnumSymbols) == None) && (local_70->isSymbol == true)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pPVar3 = propertyRecord;
          *(undefined4 *)
           &(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x32c,
                                      "(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol())"
                                      ,
                                      "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols"
                                     );
          if (!bVar4) goto LAB_00c5a265;
          *(undefined4 *)
           &(pPVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = 0;
          pDVar11 = local_60;
        }
        bVar4 = JsUtil::
                BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                ::TryGetValue<Js::PropertyRecord_const*>
                          ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                            *)(this->propertyMap).ptr,&local_70,&local_48);
LAB_00c5a1a4:
        if (((bVar4 != false) && ((local_48._0_2_ & 0x1800) == 0)) &&
           (((local_48.Attributes | flags) & EnumNonEnumerable) != None)) {
          if (local_50 != (EnumeratorFlags *)0x0) {
            *local_50 = local_48.Attributes;
          }
          return 1;
        }
      }
      *index = *index + 1;
    }
  }
  return 0;
}

Assistant:

inline BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty_BigPropertyIndex(ScriptContext* scriptContext, TPropertyIndex& index,
        JavascriptString** propertyStringName, PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        Assert(propertyStringName);
        Assert(propertyId);
        Assert(type);
        Assert(typeToEnumerate);

        if(type == typeToEnumerate)
        {
            for( ; index < propertyMap->Count(); ++index )
            {
                SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor(propertyMap->GetValueAt(index));
                if( !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) && (!!(flags & EnumeratorFlags::EnumNonEnumerable) || (descriptor.Attributes & PropertyEnumerable)))
                {
                    auto key = propertyMap->GetKeyAt(index);

                    // Skip this property if it is a symbol and we are not including symbol properties
                    if (!(flags & EnumeratorFlags::EnumSymbols) && TMapKey_IsSymbol(key, scriptContext))
                    {
                        continue;
                    }

                    if (attributes != nullptr)
                    {
                        *attributes = descriptor.Attributes;
                    }

                    *propertyId = TMapKey_GetPropertyId(scriptContext, key);
                    *propertyStringName = scriptContext->GetPropertyString(*propertyId);

                    return TRUE;
                }
            }

            return FALSE;
        }

        // Need to enumerate a different type than the current one. This is because type snapshot enumerate is enabled and the
        // object's type changed since enumeration began, so need to enumerate properties of the initial type.
        DynamicTypeHandler *const typeHandlerToEnumerate = typeToEnumerate->GetTypeHandler();
        for(
            ;
            typeHandlerToEnumerate->FindNextProperty(
                scriptContext,
                index,
                propertyStringName,
                propertyId,
                attributes,
                typeToEnumerate,
                typeToEnumerate,
                flags,
                instance,
                info);
            ++index)
        {
            SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
            bool hasValue = false;
            if (*propertyId != Constants::NoProperty)
            {
                PropertyRecord const* propertyRecord = type->GetScriptContext()->GetPropertyName(*propertyId);

                AssertMsg(!!(flags & EnumeratorFlags::EnumSymbols) || !propertyRecord->IsSymbol(),
                    "typeHandlerToEnumerate->FindNextProperty call above should not have returned us a symbol if we are not enumerating symbols");

                hasValue = propertyMap->TryGetValue(propertyRecord, &descriptor);
            }
            else if (*propertyStringName != nullptr)
            {
                hasValue = propertyMap->TryGetValue(*propertyStringName, &descriptor);
            }
            if (hasValue &&
                !(descriptor.Attributes & (PropertyDeleted | PropertyLetConstGlobal)) &&
                (!!(flags & EnumeratorFlags::EnumNonEnumerable) || descriptor.Attributes & PropertyEnumerable))
            {
                if (attributes != nullptr)
                {
                    *attributes = descriptor.Attributes;
                }

                return TRUE;
            }
        }

        return FALSE;
    }